

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlEntityPtr xmlParseStringPEReference(xmlParserCtxtPtr ctxt,xmlChar **str)

{
  xmlChar *str1;
  xmlParserCtxtPtr local_40;
  xmlEntityPtr entity;
  xmlChar *name;
  xmlChar *pxStack_28;
  xmlChar cur;
  xmlChar *ptr;
  xmlChar **str_local;
  xmlParserCtxtPtr ctxt_local;
  
  local_40 = (xmlParserCtxtPtr)0x0;
  if ((str == (xmlChar **)0x0) || (*str == (xmlChar *)0x0)) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else if (**str == '%') {
    pxStack_28 = *str + 1;
    ptr = (xmlChar *)str;
    str_local = (xmlChar **)ctxt;
    str1 = xmlParseStringName(ctxt,&stack0xffffffffffffffd8);
    if (str1 == (xmlChar *)0x0) {
      xmlFatalErrMsg((xmlParserCtxtPtr)str_local,XML_ERR_NAME_REQUIRED,
                     "xmlParseStringPEReference: no name\n");
      *(xmlChar **)ptr = pxStack_28;
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else if (*pxStack_28 == ';') {
      pxStack_28 = pxStack_28 + 1;
      str_local[0x57] = str_local[0x57] + 1;
      if ((*str_local != (xmlChar *)0x0) && (*(long *)(*str_local + 0xc0) != 0)) {
        local_40 = (xmlParserCtxtPtr)(**(code **)(*str_local + 0xc0))(str_local[1],str1);
      }
      if (*(int *)(str_local + 0x22) == -1) {
        (*xmlFree)(str1);
        *(xmlChar **)ptr = pxStack_28;
        ctxt_local = (xmlParserCtxtPtr)0x0;
      }
      else {
        if (local_40 == (xmlParserCtxtPtr)0x0) {
          if ((*(int *)(str_local + 6) == 1) ||
             ((*(int *)((long)str_local + 0x8c) == 0 && (*(int *)(str_local + 0x12) == 0)))) {
            xmlFatalErrMsgStr((xmlParserCtxtPtr)str_local,XML_ERR_UNDECLARED_ENTITY,
                              "PEReference: %%%s; not found\n",str1);
          }
          else {
            xmlWarningMsg((xmlParserCtxtPtr)str_local,XML_WAR_UNDECLARED_ENTITY,
                          "PEReference: %%%s; not found\n",str1,(xmlChar *)0x0);
            *(undefined4 *)(str_local + 0x13) = 0;
          }
          xmlParserEntityCheck((xmlParserCtxtPtr)str_local,0,(xmlEntityPtr)0x0,0);
        }
        else if ((local_40->nodeMax != 4) && (local_40->nodeMax != 5)) {
          xmlWarningMsg((xmlParserCtxtPtr)str_local,XML_WAR_UNDECLARED_ENTITY,
                        "%%%s; is not a parameter entity\n",str1,(xmlChar *)0x0);
        }
        *(undefined4 *)(str_local + 0x12) = 1;
        (*xmlFree)(str1);
        *(xmlChar **)ptr = pxStack_28;
        ctxt_local = local_40;
      }
    }
    else {
      xmlFatalErr((xmlParserCtxtPtr)str_local,XML_ERR_ENTITYREF_SEMICOL_MISSING,(char *)0x0);
      (*xmlFree)(str1);
      *(xmlChar **)ptr = pxStack_28;
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
  }
  else {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  return (xmlEntityPtr)ctxt_local;
}

Assistant:

static xmlEntityPtr
xmlParseStringPEReference(xmlParserCtxtPtr ctxt, const xmlChar **str) {
    const xmlChar *ptr;
    xmlChar cur;
    xmlChar *name;
    xmlEntityPtr entity = NULL;

    if ((str == NULL) || (*str == NULL)) return(NULL);
    ptr = *str;
    cur = *ptr;
    if (cur != '%')
        return(NULL);
    ptr++;
    name = xmlParseStringName(ctxt, &ptr);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
		       "xmlParseStringPEReference: no name\n");
	*str = ptr;
	return(NULL);
    }
    cur = *ptr;
    if (cur != ';') {
	xmlFatalErr(ctxt, XML_ERR_ENTITYREF_SEMICOL_MISSING, NULL);
	xmlFree(name);
	*str = ptr;
	return(NULL);
    }
    ptr++;

    /*
     * Increase the number of entity references parsed
     */
    ctxt->nbentities++;

    /*
     * Request the entity from SAX
     */
    if ((ctxt->sax != NULL) &&
	(ctxt->sax->getParameterEntity != NULL))
	entity = ctxt->sax->getParameterEntity(ctxt->userData, name);
    if (ctxt->instate == XML_PARSER_EOF) {
	xmlFree(name);
	*str = ptr;
	return(NULL);
    }
    if (entity == NULL) {
	/*
	 * [ WFC: Entity Declared ]
	 * In a document without any DTD, a document with only an
	 * internal DTD subset which contains no parameter entity
	 * references, or a document with "standalone='yes'", ...
	 * ... The declaration of a parameter entity must precede
	 * any reference to it...
	 */
	if ((ctxt->standalone == 1) ||
	    ((ctxt->hasExternalSubset == 0) && (ctxt->hasPErefs == 0))) {
	    xmlFatalErrMsgStr(ctxt, XML_ERR_UNDECLARED_ENTITY,
		 "PEReference: %%%s; not found\n", name);
	} else {
	    /*
	     * [ VC: Entity Declared ]
	     * In a document with an external subset or external
	     * parameter entities with "standalone='no'", ...
	     * ... The declaration of a parameter entity must
	     * precede any reference to it...
	     */
	    xmlWarningMsg(ctxt, XML_WAR_UNDECLARED_ENTITY,
			  "PEReference: %%%s; not found\n",
			  name, NULL);
	    ctxt->valid = 0;
	}
	xmlParserEntityCheck(ctxt, 0, NULL, 0);
    } else {
	/*
	 * Internal checking in case the entity quest barfed
	 */
	if ((entity->etype != XML_INTERNAL_PARAMETER_ENTITY) &&
	    (entity->etype != XML_EXTERNAL_PARAMETER_ENTITY)) {
	    xmlWarningMsg(ctxt, XML_WAR_UNDECLARED_ENTITY,
			  "%%%s; is not a parameter entity\n",
			  name, NULL);
	}
    }
    ctxt->hasPErefs = 1;
    xmlFree(name);
    *str = ptr;
    return(entity);
}